

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void reportError(Error error)

{
  long lVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  int iVar4;
  string line;
  key_type local_3c;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<(poVar2,anon_var_dwarf_784f);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,nextToken.lineNo.row + 1);
  poVar2 = std::operator<<(poVar2,anon_var_dwarf_7868);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,nextToken.lineNo.col);
  poVar2 = std::operator<<(poVar2,anon_var_dwarf_7881);
  pmVar3 = std::
           map<Error,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Error>,_std::allocator<std::pair<const_Error,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&errorTable_abi_cxx11_,&local_3c);
  poVar2 = std::operator<<(poVar2,(string *)pmVar3);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  std::ios::clear((int)file + (int)*(undefined8 *)(*(long *)file + -0x18));
  std::istream::seekg((long)file,_S_beg);
  for (iVar4 = nextToken.lineNo.row; 0 < iVar4; iVar4 = iVar4 + -1) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(file,(string *)&local_38);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_38);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(file,(string *)&local_38);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_38);
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar1 = *(long *)(std::cout + -0x18);
  std::ios::fill();
  *(undefined1 *)(lVar1 + 0x113210) = 0x20;
  *(long *)(std::istream::seekg + *(long *)(std::cout + -0x18)) = (long)nextToken.lineNo.col + -1;
  poVar2 = std::operator<<((ostream *)&std::cout,"~~~~~~^");
  std::endl<char,std::char_traits<char>>(poVar2);
  system("pause");
  exit(0);
}

Assistant:

void reportError(Error error)
{
    cout<<endl<<"行"<<nextToken.lineNo.row+1<<" 列"<<nextToken.lineNo.col<<" 出现错误:"<<errorTable[error]<<endl<<endl;
    string line;
    file->clear();
    file->seekg(0,ios::beg);
    for(int i=nextToken.lineNo.row;i>0;i--)
        getline(*file,line);
    cout<<line<<endl;
    getline(*file,line);
    cout<<line<<endl;
    cout.fill(' ');
    cout.width(nextToken.lineNo.col-1);
    cout<<"~~~~~~^"<<endl;
    system("pause");
    exit(0);
}